

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O3

void xercesc_4_0::XTemplateSerializer::storeObject
               (NameIdPool<xercesc_4_0::XMLNotationDecl> *objToStore,XSerializeEngine *serEng)

{
  XMLSize_t XVar1;
  bool bVar2;
  ulong uVar3;
  XMLNotationDecl *pXVar4;
  NameIdPoolEnumerator<xercesc_4_0::XMLNotationDecl> e;
  NameIdPoolEnumerator<xercesc_4_0::XMLNotationDecl> local_30;
  
  bVar2 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar2) {
    local_30.fMemoryManager = objToStore->fMemoryManager;
    local_30.super_XMLEnumerator<xercesc_4_0::XMLNotationDecl>._vptr_XMLEnumerator =
         (_func_int **)&PTR__XMLEnumerator_00407480;
    XVar1 = objToStore->fIdCounter;
    local_30.fCurIndex = (XMLSize_t)(XVar1 != 0);
    local_30.fToEnum = objToStore;
    XSerializeEngine::operator<<(serEng,(uint)XVar1);
    if (XVar1 != 0) {
      uVar3 = 1;
      do {
        if ((local_30.fToEnum)->fIdCounter < uVar3) {
          return;
        }
        pXVar4 = NameIdPoolEnumerator<xercesc_4_0::XMLNotationDecl>::nextElement(&local_30);
        (*(pXVar4->super_XSerializable)._vptr_XSerializable[3])(pXVar4,serEng);
        uVar3 = local_30.fCurIndex;
      } while (local_30.fCurIndex != 0);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(NameIdPool<XMLNotationDecl>* const objToStore
                                    , XSerializeEngine&                  serEng)
{
    if (serEng.needToStoreObject(objToStore))
    {
        NameIdPoolEnumerator<XMLNotationDecl> e(objToStore, objToStore->getMemoryManager());

        serEng<<(unsigned int)e.size();

        while (e.hasMoreElements())
        {
            XMLNotationDecl& data = e.nextElement();
            data.serialize(serEng);
        }
    }
}